

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

HEADER_HANDLE header_clone(HEADER_HANDLE value)

{
  HEADER_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (HEADER_HANDLE)malloc(8);
  if (__ptr != (HEADER_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (HEADER_HANDLE)0x0;
}

Assistant:

HEADER_HANDLE header_clone(HEADER_HANDLE value)
{
    HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)malloc(sizeof(HEADER_INSTANCE));
    if (header_instance != NULL)
    {
        header_instance->composite_value = amqpvalue_clone(((HEADER_INSTANCE*)value)->composite_value);
        if (header_instance->composite_value == NULL)
        {
            free(header_instance);
            header_instance = NULL;
        }
    }

    return header_instance;
}